

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

String * Error::getErrorString(String *__return_storage_ptr__,uint error)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  Iterator IVar4;
  char *s;
  usize length;
  uint32 threadId;
  String local_38;
  
  if (error == 0x10000) {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&Private::mutex);
    if (iVar2 != 0) {
      iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                            ,0x77,"pthread_mutex_lock(&Private::mutex) == 0");
      if (iVar2 != 0) goto LAB_0010f7be;
    }
    lVar3 = syscall(0xba);
    threadId = (uint32)lVar3;
    IVar4 = Map<unsigned_int,_Error::Private::Str>::find(&Private::userErrorStrings,&threadId);
    if (IVar4.item != Private::userErrorStrings._end.item) {
      Private::Str::operator_cast_to_String(&local_38,&(IVar4.item)->value);
      String::operator=(__return_storage_ptr__,&local_38);
      String::~String(&local_38);
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&Private::mutex);
    if (iVar2 != 0) {
      iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                            ,0x85,"pthread_mutex_unlock(&Private::mutex) == 0");
      if (iVar2 != 0) {
LAB_0010f7be:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
  }
  else {
    s = strerror(error);
    length = String::length(s);
    String::String(__return_storage_ptr__,s,length);
  }
  return __return_storage_ptr__;
}

Assistant:

String Error::getErrorString(uint error)
{
  if(error == 0x10000)
  {
    String errorStr;
#ifdef _WIN32
    EnterCriticalSection(&Private::cs);
#else
    VERIFY(pthread_mutex_lock(&Private::mutex) == 0);
#endif

#ifdef _WIN32
    uint32 threadId = (uint32)GetCurrentThreadId();
#else
    uint32 threadId = (uint32)syscall(__NR_gettid);
#endif
    Map<uint32, Error::Private::Str>::Iterator it = Private::userErrorStrings.find(threadId);
    if(it != Private::userErrorStrings.end())
      errorStr = *it;
#ifdef _WIN32
    LeaveCriticalSection(&Private::cs);
#else
    VERIFY(pthread_mutex_unlock(&Private::mutex) == 0);
#endif
    return errorStr;
  }

#ifdef _WIN32
  TCHAR errorMessage[256];
  DWORD len = FormatMessage(
        FORMAT_MESSAGE_FROM_SYSTEM |
        FORMAT_MESSAGE_IGNORE_INSERTS,
        NULL,
        error,
        MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
        (LPTSTR) errorMessage,
        256, NULL );
  ASSERT(len >= 0 && len <= 256);
  while(len > 0 && String::isSpace(errorMessage[len - 1]))
    --len;
  errorMessage[len] = '\0';
  return String(errorMessage, len);
#else
  const char* errorMessage = strerror(error);
  return String(errorMessage, String::length(errorMessage));
#endif
}